

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SameValueComparer.h
# Opt level: O3

hash_t Js::SameValueComparerCommon<void_*,_true>::HashDouble(double d)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  
  bVar1 = NumberUtilities::IsNan(d);
  uVar2 = 0;
  if (!bVar1) {
    bVar1 = NumberUtilities::IsSpecial(d,0x8000000000000000);
    dVar3 = 0.0;
    if (!bVar1) {
      dVar3 = d;
    }
    uVar2 = (uint)((ulong)dVar3 >> 0x20) ^ SUB84(dVar3,0);
  }
  return uVar2;
}

Assistant:

static hash_t HashDouble(double d)
        {
            if (JavascriptNumber::IsNan(d))
            {
                return 0;
            }

            if (zero)
            {
                // SameValueZero treats -0 and +0 the same, so normalize to get same hash code
                if (JavascriptNumber::IsNegZero(d))
                {
                    d = 0.0;
                }
            }

            __int64 v = *(__int64*)&d;
            return (uint)v ^ (uint)(v >> 32);
        }